

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O0

void __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::SOS_1or2_Constraint<1>_>
::ConvertConstraint(ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::SOS_1or2_Constraint<1>_>
                    *this,Container *cnt,int i)

{
  Context ctx;
  FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *pFVar1;
  Container *cnt_00;
  undefined4 in_EDX;
  Container *in_RSI;
  ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::SOS_1or2_Constraint<1>_>
  *in_RDI;
  SOS_1or2_Constraint<1> *unaff_retaddr;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_00000008;
  Context ctx_redef;
  int iVar2;
  undefined4 in_stack_ffffffffffffffd0;
  
  pFVar1 = GetConverter(in_RDI);
  iVar2 = (int)((ulong)pFVar1 >> 0x20);
  cnt_00 = (Container *)Container::GetCon((Container *)0x372130);
  Container::GetDepth(in_RSI);
  ctx = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
        ::RunConversion<mp::SOS_1or2_Constraint<1>>
                  (in_stack_00000008,unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  Container::SetRedefContext(in_RSI,ctx);
  MarkAsBridged((ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::SOS_1or2_Constraint<1>_>
                 *)CONCAT44(in_EDX,in_stack_ffffffffffffffd0),cnt_00,iVar2);
  return;
}

Assistant:

void ConvertConstraint(Container& cnt, int i) {
    assert(!cnt.IsRedundant());
    assert(cnt.GetRedefContext().IsNone());
    auto ctx_redef
        = GetConverter().RunConversion(cnt.GetCon(), i, cnt.GetDepth());
    cnt.SetRedefContext(ctx_redef);
    assert(!cnt.GetCon().HasResultVar()
           || cnt.GetCon().GetContext().IsSubsetOf(ctx_redef));
    MarkAsBridged(cnt, i);
  }